

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O3

int xmlIsMixedElement(xmlDocPtr doc,xmlChar *name)

{
  xmlElementPtr pxVar1;
  int iVar2;
  
  if (doc == (xmlDocPtr)0x0) {
    return -1;
  }
  if (doc->intSubset == (xmlDtdPtr)0x0) {
    return -1;
  }
  pxVar1 = xmlGetDtdElementDesc(doc->intSubset,name);
  if (pxVar1 == (xmlElementPtr)0x0) {
    if (doc->extSubset == (xmlDtdPtr)0x0) {
      return -1;
    }
    pxVar1 = xmlGetDtdElementDesc(doc->extSubset,name);
    if (pxVar1 == (xmlElementPtr)0x0) {
      return -1;
    }
  }
  iVar2 = 1;
  if ((ulong)pxVar1->etype < 5) {
    iVar2 = *(int *)(&DAT_001cfc94 + (ulong)pxVar1->etype * 4);
  }
  return iVar2;
}

Assistant:

int
xmlIsMixedElement(xmlDocPtr doc, const xmlChar *name) {
    xmlElementPtr elemDecl;

    if ((doc == NULL) || (doc->intSubset == NULL)) return(-1);

    elemDecl = xmlGetDtdElementDesc(doc->intSubset, name);
    if ((elemDecl == NULL) && (doc->extSubset != NULL))
	elemDecl = xmlGetDtdElementDesc(doc->extSubset, name);
    if (elemDecl == NULL) return(-1);
    switch (elemDecl->etype) {
	case XML_ELEMENT_TYPE_UNDEFINED:
	    return(-1);
	case XML_ELEMENT_TYPE_ELEMENT:
	    return(0);
        case XML_ELEMENT_TYPE_EMPTY:
	    /*
	     * return 1 for EMPTY since we want VC error to pop up
	     * on <empty>     </empty> for example
	     */
	case XML_ELEMENT_TYPE_ANY:
	case XML_ELEMENT_TYPE_MIXED:
	    return(1);
    }
    return(1);
}